

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_NtkRemoveFanin(Sfm_Ntk_t *p,int iNode,int iFanin)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  if ((iNode < p->nPis) || (p->nObjs <= p->nPos + iNode)) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x10a,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
  }
  if (p->nObjs <= p->nPos + iFanin) {
    __assert_fail("!Sfm_ObjIsPo(p, iFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x10b,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
  }
  if ((iNode < 0) || ((p->vFanins).nSize <= iNode)) {
LAB_0053085b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar2 = (p->vFanins).pArray;
  uVar1 = pVVar2[(uint)iNode].nSize;
  uVar6 = 0;
  bVar11 = 0 < (int)uVar1;
  if (0 < (int)uVar1) {
    bVar11 = true;
    if (*pVVar2[(uint)iNode].pArray != iFanin) {
      uVar9 = 0;
      do {
        if ((ulong)uVar1 - 1 == uVar9) {
          bVar11 = false;
          uVar6 = (ulong)uVar1;
          goto LAB_00530742;
        }
        uVar6 = uVar9 + 1;
        lVar4 = uVar9 + 1;
        uVar9 = uVar6;
      } while (pVVar2[(uint)iNode].pArray[lVar4] != iFanin);
      bVar11 = uVar6 < uVar1;
    }
  }
LAB_00530742:
  uVar5 = (uint)uVar6;
  if (uVar5 != uVar1) {
    if (!bVar11) {
LAB_005308b8:
      __assert_fail("i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,999,"int Vec_IntRemove(Vec_Int_t *, int)");
    }
    uVar10 = uVar1;
    if ((int)(uVar5 + 1) < (int)uVar1) {
      piVar3 = pVVar2[(uint)iNode].pArray;
      piVar8 = piVar3 + (uVar5 + 1);
      uVar6 = uVar6 & 0xffffffff;
      do {
        iVar7 = (int)uVar6;
        piVar3[uVar6] = *piVar8;
        uVar10 = pVVar2[(uint)iNode].nSize;
        piVar8 = piVar8 + 1;
        uVar6 = (ulong)(iVar7 + 1);
      } while (iVar7 + 2 < (int)uVar10);
    }
    pVVar2[(uint)iNode].nSize = uVar10 - 1;
    if (uVar5 != uVar1) {
      if ((-1 < iFanin) && (iFanin < (p->vFanouts).nSize)) {
        pVVar2 = (p->vFanouts).pArray;
        uVar1 = pVVar2[(uint)iFanin].nSize;
        uVar6 = 0;
        bVar11 = 0 < (int)uVar1;
        if (0 < (int)uVar1) {
          bVar11 = true;
          if (*pVVar2[(uint)iFanin].pArray != iNode) {
            uVar9 = 0;
            do {
              if ((ulong)uVar1 - 1 == uVar9) {
                bVar11 = false;
                uVar6 = (ulong)uVar1;
                goto LAB_005307fd;
              }
              uVar6 = uVar9 + 1;
              lVar4 = uVar9 + 1;
              uVar9 = uVar6;
            } while (pVVar2[(uint)iFanin].pArray[lVar4] != iNode);
            bVar11 = uVar6 < uVar1;
          }
        }
LAB_005307fd:
        uVar5 = (uint)uVar6;
        if (uVar5 != uVar1) {
          if (!bVar11) goto LAB_005308b8;
          uVar10 = uVar1;
          if ((int)(uVar5 + 1) < (int)uVar1) {
            piVar3 = pVVar2[(uint)iFanin].pArray;
            piVar8 = piVar3 + (uVar5 + 1);
            uVar6 = uVar6 & 0xffffffff;
            do {
              iVar7 = (int)uVar6;
              piVar3[uVar6] = *piVar8;
              uVar10 = pVVar2[(uint)iFanin].nSize;
              piVar8 = piVar8 + 1;
              uVar6 = (ulong)(iVar7 + 1);
            } while (iVar7 + 2 < (int)uVar10);
          }
          pVVar2[(uint)iFanin].nSize = uVar10 - 1;
          if (uVar5 != uVar1) {
            return;
          }
        }
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                      ,0x10f,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
      }
      goto LAB_0053085b;
    }
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                ,0x10d,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
}

Assistant:

void Sfm_NtkRemoveFanin( Sfm_Ntk_t * p, int iNode, int iFanin )
{
    int RetValue;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( !Sfm_ObjIsPo(p, iFanin) );
    RetValue = Vec_IntRemove( Sfm_ObjFiArray(p, iNode), iFanin );
    assert( RetValue );
    RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );
    assert( RetValue );
}